

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.cpp
# Opt level: O2

bool __thiscall Diligent::QueryVkImpl::OnEndQuery(QueryVkImpl *this,DeviceContextVkImpl *pContext)

{
  bool bVar1;
  int iVar2;
  QueryManagerVk *pQVar3;
  undefined4 extraout_var;
  char (*in_RCX) [23];
  char (*in_R8) [45];
  string _msg;
  
  QueryBase<Diligent::EngineVkImplTraits>::OnEndQuery
            (&this->super_QueryBase<Diligent::EngineVkImplTraits>,pContext);
  if (((this->super_QueryBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
       .m_Desc.Type != QUERY_TYPE_TIMESTAMP) || (bVar1 = AllocateQueries(this), bVar1)) {
    if ((*(int *)&(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44 != -1) &&
       (((this->super_QueryBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
         .m_Desc.Type != QUERY_TYPE_DURATION || (*(int *)&this->field_0x48 != -1)))) {
      pQVar3 = this->m_pQueryMgr;
      if (pQVar3 == (QueryManagerVk *)0x0) {
        FormatString<char[26],char[23]>
                  (&_msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pQueryMgr != nullptr",in_RCX);
        DebugAssertionFailed
                  (_msg._M_dataplus._M_p,"OnEndQuery",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
                   ,0x81);
        std::__cxx11::string::~string((string *)&_msg);
        pQVar3 = this->m_pQueryMgr;
      }
      iVar2 = (*(((((this->super_QueryBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                   .m_pDevice)->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).m_CommandQueues[(pQVar3->m_CommandQueueId).m_Value].CmdQueue.m_pObject)->
                super_ICommandQueue).super_IObject._vptr_IObject[4])();
      this->m_QueryEndFenceValue = CONCAT44(extraout_var,iVar2);
      return true;
    }
    FormatString<char[8],char_const*,char[45]>
              (&_msg,(Diligent *)"Query \'",
               (char (*) [8])
               &(this->super_QueryBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                .m_Desc,(char **)"\' is invalid: Vulkan query allocation failed",in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  return false;
}

Assistant:

bool QueryVkImpl::OnEndQuery(DeviceContextVkImpl* pContext)
{
    TQueryBase::OnEndQuery(pContext);

    if (m_Desc.Type == QUERY_TYPE_TIMESTAMP)
    {
        if (!AllocateQueries())
            return false;
    }

    if (m_QueryPoolIndex[0] == QueryManagerVk::InvalidIndex || (m_Desc.Type == QUERY_TYPE_DURATION && m_QueryPoolIndex[1] == QueryManagerVk::InvalidIndex))
    {
        LOG_ERROR_MESSAGE("Query '", m_Desc.Name, "' is invalid: Vulkan query allocation failed");
        return false;
    }

    VERIFY_EXPR(m_pQueryMgr != nullptr);
    auto CmdQueueId      = m_pQueryMgr->GetCommandQueueId();
    m_QueryEndFenceValue = m_pDevice->GetNextFenceValue(CmdQueueId);

    return true;
}